

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__malloc_mad2(int a,int b,int add)

{
  bool bVar1;
  void *pvVar2;
  
  if ((b | a) < 0) {
    bVar1 = true;
  }
  else if (b == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = (int)(0x7fffffffU / (uint)b) < a;
  }
  if ((int)(add ^ 0x7fffffffU) < b * a || bVar1) {
    return (void *)0x0;
  }
  pvVar2 = malloc((long)(b * a + add));
  return pvVar2;
}

Assistant:

static void *stbi__malloc_mad2(int a, int b, int add)
{
   if (!stbi__mad2sizes_valid(a, b, add)) return NULL;
   return stbi__malloc(a*b + add);
}